

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

int Tas_ManSolve_rec(Tas_Man_t *p,int Level)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t **ppGVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  uint uVar12;
  int Level_00;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  Gia_Obj_t *pGVar18;
  bool bVar19;
  float fVar20;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Tas_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                  ,0x50c,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
  }
  iVar7 = Tas_ManPropagate(p,Level);
  if (iVar7 != 0) {
    Tas_ManCreateCls(p,iVar7);
    return iVar7;
  }
  iVar7 = (p->pProp).iHead;
  if (iVar7 != (p->pProp).iTail) {
    __assert_fail("Tas_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                  ,0x513,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
  }
  iVar3 = (p->pJust).iHead;
  iVar4 = (p->pJust).iTail;
  iVar8 = iVar4 - iVar3;
  if (iVar8 == 0) {
    return 0;
  }
  iVar14 = (p->Pars).nJustThis;
  if (iVar8 < iVar14) {
    iVar8 = iVar14;
  }
  (p->Pars).nJustThis = iVar8;
  if ((p->Pars).nJustLimit < iVar8) {
    return 0;
  }
  if ((p->Pars).nBTLimit < (p->Pars).nBTThis) {
    return 0;
  }
  lVar15 = (long)iVar4;
  iVar8 = iVar4;
  if (iVar3 < iVar4) {
    lVar16 = (long)iVar3;
    do {
      ppGVar9 = (p->pJust).pData;
      pGVar18 = ppGVar9[lVar16];
      iVar14 = iVar8;
      if (iVar8 == (p->pJust).nSize) {
        (p->pJust).nSize = iVar8 * 2;
        ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)(iVar8 * 2) << 3);
        iVar14 = (p->pJust).iTail;
        (p->pJust).pData = ppGVar9;
      }
      iVar8 = iVar14 + 1;
      (p->pJust).iTail = iVar8;
      ppGVar9[iVar14] = pGVar18;
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
  }
  (p->pJust).iHead = iVar4;
  if ((p->Pars).fUseActive == 0) {
    if ((p->Pars).fUseHighest == 0) {
      if ((p->Pars).fUseLowest == 0) {
        if ((p->Pars).fUseMaxFF == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                        ,0x527,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
        }
        pGVar18 = Tas_ManDecideMaxFF(p);
      }
      else {
        if (iVar8 <= iVar4) goto LAB_0066e682;
        pGVar18 = (Gia_Obj_t *)0x0;
        do {
          pGVar5 = (p->pJust).pData[lVar15];
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar10 = pGVar18;
          if (pGVar5 < pGVar18) {
            pGVar10 = pGVar5;
          }
          bVar19 = pGVar18 == (Gia_Obj_t *)0x0;
          pGVar18 = pGVar10;
          if (bVar19) {
            pGVar18 = pGVar5;
          }
          lVar15 = lVar15 + 1;
        } while (iVar8 != lVar15);
      }
    }
    else {
      if (iVar8 <= iVar4) goto LAB_0066e682;
      pGVar18 = (Gia_Obj_t *)0x0;
      do {
        pGVar5 = (p->pJust).pData[lVar15];
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        if (pGVar18 < pGVar5) {
          pGVar18 = pGVar5;
        }
        lVar15 = lVar15 + 1;
      } while (iVar8 != lVar15);
    }
    if (pGVar18 != (Gia_Obj_t *)0x0) {
      uVar13 = (uint)*(undefined8 *)pGVar18;
      if ((((int)uVar13 < 0) || (uVar11 = uVar13 & 0x1fffffff, uVar11 == 0x1fffffff)) ||
         ((pGVar18[-(ulong)uVar11].field_0x3 & 0x40) != 0)) {
LAB_0066e7eb:
        __assert_fail("Tas_VarIsJust( pVar )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                      ,0x52b,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
      }
      uVar12 = (uint)((ulong)*(undefined8 *)pGVar18 >> 0x20);
      uVar17 = (ulong)(uVar12 & 0x1fffffff);
      if ((pGVar18[-uVar17].field_0x3 & 0x40) != 0) goto LAB_0066e7eb;
      pGVar5 = pGVar18 + -(ulong)uVar11;
      pGVar6 = p->pAig;
      pGVar10 = pGVar6->pObjs;
      if (((pGVar5 < pGVar10) || (pGVar10 + pGVar6->nObjs <= pGVar5)) ||
         ((pGVar18 = pGVar18 + -uVar17, pGVar18 < pGVar10 || (pGVar10 + pGVar6->nObjs <= pGVar18))))
      {
LAB_0066e78e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (pGVar6->pRefs[(int)((ulong)((long)pGVar18 - (long)pGVar10) >> 2) * -0x55555555] <
          pGVar6->pRefs[(int)((ulong)((long)pGVar5 - (long)pGVar10) >> 2) * -0x55555555]) {
        uVar17 = (ulong)(uVar13 >> 0x1d & 1) ^ (ulong)pGVar5;
      }
      else {
        uVar17 = (ulong)(uVar12 >> 0x1d & 1) ^ (ulong)pGVar18;
      }
      pGVar18 = (Gia_Obj_t *)(uVar17 ^ 1);
      goto LAB_0066e685;
    }
  }
  else if (iVar4 < iVar8) {
    fVar20 = 0.0;
    lVar16 = 0;
    pGVar18 = (Gia_Obj_t *)0x0;
    do {
      pGVar5 = (p->pJust).pData[lVar15 + lVar16];
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar13 = (uint)*(undefined8 *)pGVar5;
      if ((int)uVar13 < 0) {
LAB_0066e7cc:
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                      ,0x1d5,"Gia_Obj_t *Tas_ManFindActive(Tas_Man_t *)");
      }
      uVar13 = uVar13 & 0x1fffffff;
      if (uVar13 == 0x1fffffff) goto LAB_0066e7cc;
      pGVar10 = p->pAig->pObjs;
      if ((pGVar5 < pGVar10) || (pGVar10 + p->pAig->nObjs <= pGVar5)) goto LAB_0066e78e;
      iVar14 = (int)((long)pGVar5 - (long)pGVar10 >> 2) * -0x55555555;
      fVar2 = p->pActivity[(int)(iVar14 - uVar13)];
      if (pGVar18 == (Gia_Obj_t *)0x0) {
LAB_0066e4bb:
        pGVar18 = pGVar5 + -(ulong)uVar13;
        fVar20 = fVar2;
      }
      else if ((fVar20 < fVar2) ||
              (((fVar2 == fVar20 && (!NAN(fVar2) && !NAN(fVar20))) &&
               (pGVar18 < pGVar5 + -(ulong)uVar13)))) goto LAB_0066e4bb;
      uVar13 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) & 0x1fffffff;
      fVar2 = p->pActivity[(int)(iVar14 - uVar13)];
      if ((fVar20 < fVar2) ||
         (((fVar2 == fVar20 && (!NAN(fVar2) && !NAN(fVar20))) && (pGVar18 < pGVar5 + -(ulong)uVar13)
          ))) {
        pGVar18 = pGVar5 + -(ulong)uVar13;
        fVar20 = fVar2;
      }
      lVar16 = lVar16 + 1;
    } while (iVar8 - iVar4 != (int)lVar16);
    goto LAB_0066e685;
  }
LAB_0066e682:
  pGVar18 = (Gia_Obj_t *)0x0;
LAB_0066e685:
  Level_00 = Level + 1;
  Tas_ManAssign(p,pGVar18,Level_00,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
  iVar14 = Tas_ManSolve_rec(p,Level_00);
  iVar8 = 0;
  if ((iVar14 != 0) &&
     (pGVar5 = (p->pClauses).pData[iVar14], iVar8 = iVar14,
     pGVar5 == (Gia_Obj_t *)((ulong)pGVar18 & 0xfffffffffffffffe))) {
    Tas_ManCancelUntil(p,iVar7);
    (p->pJust).iHead = iVar3;
    (p->pJust).iTail = iVar4;
    Tas_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar18 ^ 1),Level_00,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
    iVar7 = Tas_ManSolve_rec(p,Level_00);
    iVar8 = 0;
    if ((iVar7 != 0) && (ppGVar9 = (p->pClauses).pData, iVar8 = iVar7, ppGVar9[iVar7] == pGVar5)) {
      iVar8 = Tas_ManResolve(p,iVar14,iVar7,(int)ppGVar9);
      Tas_ManCreateCls(p,iVar8);
      piVar1 = &(p->Pars).nBTThis;
      *piVar1 = *piVar1 + 1;
    }
  }
  return iVar8;
}

Assistant:

int Tas_ManSolve_rec( Tas_Man_t * p, int Level )
{ 
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pVar, * pDecVar = NULL;
    int hClause, hLearn0, hLearn1;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Tas_QueIsEmpty(&p->pProp) );
    if ( (hClause = Tas_ManPropagate( p, Level )) )
    {
        Tas_ManCreateCls( p, hClause );
        return hClause;
    }
    // check for satisfying assignment
    assert( Tas_QueIsEmpty(&p->pProp) );
    if ( Tas_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Tas_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Tas_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseActive )
        pVar = NULL, pDecVar = Tas_ManFindActive( p );
    else if ( p->Pars.fUseHighest )
//        pVar = NULL, pDecVar = Tas_ManDecideHighestFanin( p );
        pVar = Tas_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Tas_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Tas_ManDecideMaxFF( p );
    else assert( 0 );
    // chose decision variable using fanout count
    if ( pVar != NULL )
    {
        assert( Tas_VarIsJust( pVar ) );
        if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
            pDecVar = Gia_Not(Gia_ObjChild0(pVar));
        else
            pDecVar = Gia_Not(Gia_ObjChild1(pVar));
//        pDecVar = Gia_NotCond( pDecVar, Gia_Regular(pDecVar)->fMark1 ^ !Gia_IsComplement(pDecVar) );
    }
    // decide on first fanin
    Tas_ManAssign( p, pDecVar, Level+1, NULL, NULL );
    if ( !(hLearn0 = Tas_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0] != Gia_Regular(pDecVar) )
        return hLearn0;
    Tas_ManCancelUntil( p, iPropHead );
    Tas_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Tas_ManAssign( p, Gia_Not(pDecVar), Level+1, NULL, NULL );
    if ( !(hLearn1 = Tas_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1] != Gia_Regular(pDecVar) )
        return hLearn1;
    hClause = Tas_ManResolve( p, Level, hLearn0, hLearn1 );
    Tas_ManCreateCls( p, hClause );
//    Tas_ManPrintClauseNew( p, Level, hClause );
//    if ( Level > Tas_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}